

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3SegReaderFree(Fts3SegReader *pReader)

{
  Fts3SegReader *pReader_local;
  
  if (pReader != (Fts3SegReader *)0x0) {
    if (pReader->ppNextElem == (Fts3HashElem **)0x0) {
      sqlite3_free(pReader->zTerm);
    }
    if (pReader->rootOnly == '\0') {
      sqlite3_free(pReader->aNode);
    }
    sqlite3_blob_close(pReader->pBlob);
  }
  sqlite3_free(pReader);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3SegReaderFree(Fts3SegReader *pReader){
  if( pReader ){
    if( !fts3SegReaderIsPending(pReader) ){
      sqlite3_free(pReader->zTerm);
    }
    if( !fts3SegReaderIsRootOnly(pReader) ){
      sqlite3_free(pReader->aNode);
    }
    sqlite3_blob_close(pReader->pBlob);
  }
  sqlite3_free(pReader);
}